

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_variantSelectionMap
                   (string *__return_storage_ptr__,VariantSelectionMap *m,uint32_t indent)

{
  long *plVar1;
  _Base_ptr p_Var2;
  ostream *poVar3;
  long *plVar4;
  uint32_t n;
  uint32_t n_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_header *p_Var7;
  undefined1 auVar8 [16];
  stringstream ss;
  string local_240;
  long *local_220;
  long local_218;
  long local_210 [2];
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  undefined8 uVar5;
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((m->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_1e0 = __return_storage_ptr__;
    pprint::Indent_abi_cxx11_(&local_240,(pprint *)(ulong)indent,n);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"variants = {\n",0xd);
    uVar5 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_RDX_00;
    }
    n_00 = (uint32_t)uVar5;
    p_Var2 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    auVar8._8_8_ = uVar5;
    auVar8._0_8_ = p_Var2;
    p_Var7 = &(m->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var7) {
      do {
        p_Var6 = auVar8._0_8_;
        pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)(indent + 1),auVar8._8_4_);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"string ",7);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
        local_220 = local_210;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"\"","");
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_240,local_220,local_218 + (long)local_220);
        std::__cxx11::string::_M_append((char *)&local_240,*(ulong *)(p_Var6 + 2));
        plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_220);
        plVar1 = plVar4 + 2;
        if ((long *)*plVar4 == plVar1) {
          local_1f0 = *plVar1;
          lStack_1e8 = plVar4[3];
          local_200 = &local_1f0;
        }
        else {
          local_1f0 = *plVar1;
          local_200 = (long *)*plVar4;
        }
        local_1f8 = plVar4[1];
        *plVar4 = (long)plVar1;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_200,local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        if (local_220 != local_210) {
          operator_delete(local_220,local_210[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        auVar8 = std::_Rb_tree_increment(p_Var6);
        n_00 = auVar8._8_4_;
      } while ((_Rb_tree_header *)auVar8._0_8_ != p_Var7);
    }
    pprint::Indent_abi_cxx11_(&local_240,(pprint *)(ulong)indent,n_00);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
    __return_storage_ptr__ = local_1e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      __return_storage_ptr__ = local_1e0;
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_variantSelectionMap(const VariantSelectionMap &m,
                                      const uint32_t indent) {
  std::stringstream ss;

  if (m.empty()) {
    return ss.str();
  }

  ss << pprint::Indent(indent) << "variants = {\n";
  for (const auto &item : m) {
    ss << pprint::Indent(indent + 1) << "string " << item.first << " = "
       << quote(item.second) << "\n";
  }
  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}